

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath *
testing::internal::FilePath::ConcatPaths
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *relative_path)

{
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  FilePath dir;
  FilePath *relative_path_local;
  FilePath *directory_local;
  
  dir.pathname_.field_2._8_8_ = relative_path;
  bVar1 = IsEmpty(directory);
  if (bVar1) {
    FilePath(__return_storage_ptr__,(FilePath *)dir.pathname_.field_2._8_8_);
  }
  else {
    RemoveTrailingPathSeparator((FilePath *)local_40,directory);
    psVar2 = string_abi_cxx11_((FilePath *)local_40);
    std::operator+(&local_80,psVar2,'/');
    psVar2 = string_abi_cxx11_((FilePath *)dir.pathname_.field_2._8_8_);
    std::operator+(&local_60,&local_80,psVar2);
    FilePath(__return_storage_ptr__,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    ~FilePath((FilePath *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty())
    return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(dir.string() + kPathSeparator + relative_path.string());
}